

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

MPP_RET hal_vp8e_buf_free(void *hal)

{
  long *plVar1;
  uint local_24;
  RK_U32 i;
  Vp8eVpuBuf *buffers;
  HalVp8eCtx *ctx;
  void *hal_local;
  
  plVar1 = *(long **)((long)hal + 0x60);
  if (plVar1[3] != 0) {
    mpp_buffer_put_with_caller((MppBuffer)plVar1[3],"hal_vp8e_buf_free");
    plVar1[3] = 0;
  }
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    if (plVar1[(ulong)local_24 + 4] != 0) {
      mpp_buffer_put_with_caller((MppBuffer)plVar1[(ulong)local_24 + 4],"hal_vp8e_buf_free");
      plVar1[(ulong)local_24 + 4] = 0;
    }
  }
  if (plVar1[7] != 0) {
    mpp_buffer_put_with_caller((MppBuffer)plVar1[7],"hal_vp8e_buf_free");
    plVar1[7] = 0;
  }
  if (plVar1[6] != 0) {
    mpp_buffer_put_with_caller((MppBuffer)plVar1[6],"hal_vp8e_buf_free");
    plVar1[6] = 0;
  }
  if (plVar1[10] != 0) {
    mpp_buffer_put_with_caller((MppBuffer)plVar1[10],"hal_vp8e_buf_free");
    plVar1[10] = 0;
  }
  if (plVar1[9] != 0) {
    mpp_buffer_put_with_caller((MppBuffer)plVar1[9],"hal_vp8e_buf_free");
    plVar1[9] = 0;
  }
  if (plVar1[8] != 0) {
    mpp_buffer_put_with_caller((MppBuffer)plVar1[8],"hal_vp8e_buf_free");
    plVar1[8] = 0;
  }
  if (plVar1[0xb] != 0) {
    mpp_buffer_put_with_caller((MppBuffer)plVar1[0xb],"hal_vp8e_buf_free");
    plVar1[0xb] = 0;
  }
  if (*plVar1 != 0) {
    mpp_buffer_group_put((MppBufferGroup)*plVar1);
    *plVar1 = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp8e_buf_free(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;
    Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;

    if (buffers->hw_luma_buf) {
        mpp_buffer_put(buffers->hw_luma_buf);
        buffers->hw_luma_buf = NULL;
    }

    {
        RK_U32 i = 0;
        for (i = 0; i < 2; i++) {
            if (buffers->hw_cbcr_buf[i]) {
                mpp_buffer_put(buffers->hw_cbcr_buf[i]);
                buffers->hw_cbcr_buf[i] = NULL;
            }
        }
    }

    if (buffers->hw_size_table_buf) {
        mpp_buffer_put(buffers->hw_size_table_buf);
        buffers->hw_size_table_buf = NULL;
    }

    if (buffers->hw_cabac_table_buf) {
        mpp_buffer_put(buffers->hw_cabac_table_buf);
        buffers->hw_cabac_table_buf = NULL;
    }

    if (buffers->hw_mv_output_buf) {
        mpp_buffer_put(buffers->hw_mv_output_buf);
        buffers->hw_mv_output_buf = NULL;
    }

    if (buffers->hw_prob_count_buf) {
        mpp_buffer_put(buffers->hw_prob_count_buf);
        buffers->hw_prob_count_buf = NULL;
    }

    if (buffers->hw_segment_map_buf) {
        mpp_buffer_put(buffers->hw_segment_map_buf);
        buffers->hw_segment_map_buf = NULL;
    }

    if (buffers->hw_out_buf) {
        mpp_buffer_put(buffers->hw_out_buf);
        buffers->hw_out_buf = NULL;
    }

    if (buffers->hw_buf_grp) {
        mpp_buffer_group_put(buffers->hw_buf_grp);
        buffers->hw_buf_grp = NULL;
    }

    return MPP_OK;
}